

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

void __thiscall
Time::LocalTime::getAsDate
          (LocalTime *this,int *year,int *month,int *dayOfMonth,int *hour,int *min,int *sec,
          int *dayOfWeek)

{
  __time_t local_70;
  tm local_68;
  
  local_68.tm_isdst = 0;
  local_68._36_4_ = 0;
  local_68.tm_gmtoff = 0;
  local_68.tm_mon = 0;
  local_68.tm_year = 0;
  local_68.tm_wday = 0;
  local_68.tm_yday = 0;
  local_68.tm_sec = 0;
  local_68.tm_min = 0;
  local_68.tm_hour = 0;
  local_68.tm_mday = 0;
  local_68.tm_zone = (char *)0x0;
  local_70 = (this->super_Time).timeSinceEpoch.tv_sec;
  localtime_r(&local_70,&local_68);
  *year = local_68.tm_year;
  *month = local_68.tm_mon;
  *dayOfMonth = local_68.tm_mday;
  *hour = local_68.tm_hour;
  *min = local_68.tm_min;
  *sec = local_68.tm_sec;
  if (dayOfWeek != (int *)0x0) {
    *dayOfWeek = local_68.tm_wday;
  }
  return;
}

Assistant:

void LocalTime::getAsDate(int & year, int & month, int & dayOfMonth, int & hour, int & min, int & sec, int * dayOfWeek) const
    {
        struct tm ekT = {0};
        makeLocalTime(timeSinceEpoch.tv_sec, ekT);
        year = ekT.tm_year;
        month = ekT.tm_mon;
        dayOfMonth = ekT.tm_mday;
        hour = ekT.tm_hour;
        min = ekT.tm_min;
        sec = ekT.tm_sec;
        if (dayOfWeek) *dayOfWeek = ekT.tm_wday;
    }